

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

string_t duckdb::VectorTryCastStringOperator<duckdb::TryCastToBit>::
         Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  string_t *result;
  CastParameters *in_R9;
  string_t input_00;
  string_t input_01;
  string_t output;
  anon_union_16_2_67f50693_for_value local_60;
  string local_50;
  
  input_01.value._0_8_ = input.value._8_8_;
  result = *dataptr;
  input_01.value.pointer.ptr = (char *)&local_60;
  bVar1 = TryCastToBit::Operation<duckdb::string_t,duckdb::string_t>
                    (input.value._0_8_,input_01,result,*(Vector **)((long)dataptr + 8),in_R9);
  if (!bVar1) {
    input_00.value.pointer.ptr = (char *)result;
    input_00.value._0_8_ = input_01.value._0_8_;
    CastExceptionText<duckdb::string_t,duckdb::string_t>
              (&local_50,(duckdb *)input.value._0_8_,input_00);
    local_60.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         HandleVectorCastError::Operation<duckdb::string_t>
                   (&local_50,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_60.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(
		        OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->result, data->parameters))) {
			return output;
		}
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}